

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void max_w_cb(Fl_Value_Input *i,void *v)

{
  double dVar1;
  int iVar2;
  Fl_Type *pFVar3;
  bool bVar4;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar2 != 0) {
      Fl_Valuator::value(&i->super_Fl_Valuator,(double)*(int *)&current_widget[1].super_Fl_Type.next
                        );
      return;
    }
  }
  else if (Fl_Type::first != (Fl_Type *)0x0) {
    dVar1 = (i->super_Fl_Valuator).value_;
    bVar4 = true;
    pFVar3 = Fl_Type::first;
    do {
      while ((pFVar3->selected != '\0' &&
             (iVar2 = (*pFVar3->_vptr_Fl_Type[0x21])(pFVar3), iVar2 != 0))) {
        *(int *)&current_widget[1].super_Fl_Type.next = (int)dVar1;
        pFVar3 = pFVar3->next;
        bVar4 = false;
        if (pFVar3 == (Fl_Type *)0x0) {
LAB_00186015:
          set_modflag(1);
          return;
        }
      }
      pFVar3 = pFVar3->next;
    } while (pFVar3 != (Fl_Type *)0x0);
    if (bVar4) {
      return;
    }
    goto LAB_00186015;
  }
  return;
}

Assistant:

void max_w_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) return;
    i->value(((Fl_Window_Type*)current_widget)->sr_max_w);
  } else {
    int mod = 0;
    int n = (int)i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        ((Fl_Window_Type*)current_widget)->sr_max_w = n;
        mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}